

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SSVectorBase(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_dim,shared_ptr<soplex::Tolerances> *tol)

{
  shared_ptr<soplex::Tolerances> *in_RDX;
  int in_ESI;
  IdxSet *in_RDI;
  int **unaff_retaddr;
  undefined4 in_stack_ffffffffffffffb8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffd8;
  IdxSet *pIVar1;
  int n;
  
  pIVar1 = in_RDI;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
  n = (int)((ulong)pIVar1 >> 0x20);
  IdxSet::IdxSet(in_RDI);
  in_RDI->_vptr_IdxSet = (_func_int **)&PTR__SSVectorBase_0089caa8;
  in_RDI[1].freeArray = true;
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x4fe12d);
  if (in_ESI < 1) {
    in_ESI = 1;
  }
  in_RDI->len = in_ESI;
  spx_alloc<int*>(unaff_retaddr,n);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(in_stack_ffffffffffffffd8);
  std::shared_ptr<soplex::Tolerances>::operator=
            (in_RDX,(shared_ptr<soplex::Tolerances> *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8));
  return;
}

Assistant:

explicit SSVectorBase(int p_dim, std::shared_ptr<Tolerances> tol = nullptr)
      : VectorBase<R>(p_dim)
      , IdxSet()
      , setupStatus(true)
   {
      len = (p_dim < 1) ? 1 : p_dim;
      spx_alloc(idx, len);
      VectorBase<R>::clear();
      _tolerances = tol;

      assert(isConsistent());
   }